

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ostream * __thiscall
parser::GrammaticSymbol::stringify
          (GrammaticSymbol *this,ostream *out,TerminalNames *terminalNames,
          NonTerminalNames *nonTerminalNames)

{
  ostream *poVar1;
  char *pcVar2;
  string local_50;
  int local_2c;
  NonTerminalNames *local_28;
  NonTerminalNames *nonTerminalNames_local;
  TerminalNames *terminalNames_local;
  ostream *out_local;
  GrammaticSymbol *this_local;
  
  local_28 = nonTerminalNames;
  nonTerminalNames_local = terminalNames;
  terminalNames_local = (TerminalNames *)out;
  out_local = (ostream *)this;
  local_2c = (int)std::setw(0xe);
  poVar1 = std::operator<<(out,(_Setw)local_2c);
  pcVar2 = "NonTerminal";
  if ((this->isTerminal & 1U) != 0) {
    pcVar2 = "Terminal";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,": ");
  if ((this->isTerminal & 1U) == 0) {
    nonTerminalName(&local_50,this->value,local_28);
  }
  else {
    lexer::terminalName(&local_50,this->value,nonTerminalNames_local);
  }
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return poVar1;
}

Assistant:

std::ostream& stringify(std::ostream& out, lexer::TerminalNames const& terminalNames, NonTerminalNames const& nonTerminalNames) const {
            return out << std::setw(14)
                         << (isTerminal ? "Terminal" : "NonTerminal") << ": "
                         << (isTerminal ? lexer::terminalName(value, terminalNames) : nonTerminalName(value, nonTerminalNames));
        }